

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_repl.c
# Opt level: O2

repl_p_entry * repl_p_lru_insert(repl_p_head *head,void *element,repl_p_entry **ptr_entry)

{
  repl_p_entry *prVar1;
  repl_p_entry **pprVar2;
  repl_p_entry *prVar3;
  
  prVar3 = (repl_p_entry *)Zalloc(0x20);
  if (prVar3 != (repl_p_entry *)0x0) {
    prVar3->data = element;
    prVar3->ptr_entry = ptr_entry;
    LOCK();
    prVar1 = *ptr_entry;
    if (prVar1 == (repl_p_entry *)0x0) {
      *ptr_entry = prVar3;
    }
    UNLOCK();
    if (prVar1 != (repl_p_entry *)0x0) {
      abort();
    }
    util_mutex_lock(&head->lock);
    vmemcache_entry_acquire((cache_entry *)element);
    (prVar3->node).tqe_next = (repl_p_entry *)0x0;
    pprVar2 = (head->first).tqh_last;
    (prVar3->node).tqe_prev = pprVar2;
    *pprVar2 = prVar3;
    (head->first).tqh_last = (repl_p_entry **)prVar3;
    util_mutex_unlock(&head->lock);
  }
  return prVar3;
}

Assistant:

static struct repl_p_entry *
repl_p_lru_insert(struct repl_p_head *head, void *element,
			struct repl_p_entry **ptr_entry)
{
	struct repl_p_entry *entry = Zalloc(sizeof(struct repl_p_entry));
	if (entry == NULL)
		return NULL;

	entry->data = element;

	ASSERTne(ptr_entry, NULL);
	entry->ptr_entry = ptr_entry;

	/*
	 * 'util_bool_compare_and_swap64' must always succeed here,
	 * because this entry with ptr_entry=NULL has been considered as busy
	 * so it has never been used so far. This is the first time we set
	 * the 'entry->ptr_entry' to 'entry'.
	 */
	int rv = util_bool_compare_and_swap64(entry->ptr_entry, NULL, entry);
	if (rv == 0) {
		FATAL(
			"repl_p_lru_insert(): failed to initialize pointer to the LRU list");
	}

	util_mutex_lock(&head->lock);

	vmemcache_entry_acquire(element);
	TAILQ_INSERT_TAIL(&head->first, entry, node);

	util_mutex_unlock(&head->lock);

	return entry;
}